

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

int parse_der_pubkey(uchar *der,size_t len,mp_int *keyP,mp_int *keyQ,mp_int *keyG,mp_int *keyY)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *b;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  
  uVar5 = 0;
  uVar8 = 0;
  if ((*der & 0x3f) == 0x30) {
    pbVar10 = der + len;
    bVar2 = der[1];
    pbVar6 = der + 2;
    uVar3 = bVar2 & 0x7f;
    uVar4 = (ulong)uVar3;
    if ((char)bVar2 < '\0') {
      if ((char)uVar3 == '\0') {
        uVar4 = 0;
      }
      else {
        lVar9 = 0;
        uVar4 = 0;
        do {
          uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
          lVar9 = lVar9 + 1;
        } while ((bVar2 & 0x7f) != (uint)lVar9);
        pbVar6 = der + (ulong)(uVar3 - 1) + 3;
      }
    }
    if (der + uVar4 + 1 <= pbVar10) {
      bVar2 = *pbVar6;
      pbVar7 = pbVar6;
      if ((bVar2 & 0x3f) == 0x30) {
        bVar2 = pbVar6[1];
        pbVar7 = pbVar6 + 2;
        uVar8 = bVar2 & 0x7f;
        uVar4 = (ulong)uVar8;
        if ((char)bVar2 < '\0') {
          if ((char)uVar8 == '\0') {
            uVar4 = 0;
          }
          else {
            lVar9 = 0;
            uVar4 = 0;
            do {
              uVar4 = (ulong)pbVar7[lVar9] | uVar4 << 8;
              lVar9 = lVar9 + 1;
            } while ((bVar2 & 0x7f) != (uint)lVar9);
            pbVar7 = pbVar6 + (ulong)(uVar8 - 1) + 3;
          }
        }
        if (pbVar10 < pbVar6 + uVar4 + 1) {
          return 0;
        }
        bVar2 = *pbVar7;
        if ((bVar2 & 0x3f) == 6) {
          bVar2 = pbVar7[1];
          pbVar6 = pbVar7 + 2;
          uVar8 = bVar2 & 0x7f;
          uVar4 = (ulong)uVar8;
          if ((char)bVar2 < '\0') {
            if ((char)uVar8 == '\0') {
              return 0;
            }
            lVar9 = 0;
            uVar4 = 0;
            do {
              uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
              lVar9 = lVar9 + 1;
            } while ((bVar2 & 0x7f) != (uint)lVar9);
            pbVar6 = pbVar7 + (ulong)(uVar8 - 1) + 3;
          }
          if (uVar4 != 7) {
            return 0;
          }
          if (*(int *)(pbVar6 + 3) !=
              CONCAT31(parse_der_pubkey::ansi_x9_57._4_3_,parse_der_pubkey::ansi_x9_57[3]) ||
              *(int *)pbVar6 != parse_der_pubkey::ansi_x9_57._0_4_) {
            return 0;
          }
          bVar2 = pbVar6[7];
          pbVar7 = pbVar6 + 7;
        }
        if ((bVar2 & 0x3f) == 0x30) {
          bVar2 = pbVar7[1];
          pbVar6 = pbVar7 + 2;
          uVar8 = bVar2 & 0x7f;
          uVar4 = (ulong)uVar8;
          if ((char)bVar2 < '\0') {
            if ((char)uVar8 == '\0') {
              uVar4 = 0;
            }
            else {
              lVar9 = 0;
              uVar4 = 0;
              do {
                uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
                lVar9 = lVar9 + 1;
              } while ((bVar2 & 0x7f) != (uint)lVar9);
              pbVar6 = pbVar7 + (ulong)(uVar8 - 1) + 3;
            }
          }
          if (pbVar10 < pbVar7 + uVar4 + 1) {
            return 0;
          }
          bVar2 = *pbVar6;
          pbVar7 = pbVar6;
          if ((bVar2 & 0x3f) == 2) {
            bVar2 = pbVar6[1];
            b = pbVar6 + 2;
            uVar8 = bVar2 & 0x7f;
            uVar4 = (ulong)uVar8;
            if ((char)bVar2 < '\0') {
              if ((char)uVar8 == '\0') {
                uVar4 = 0;
              }
              else {
                lVar9 = 0;
                uVar4 = 0;
                do {
                  uVar4 = (ulong)b[lVar9] | uVar4 << 8;
                  lVar9 = lVar9 + 1;
                } while ((bVar2 & 0x7f) != (uint)lVar9);
                b = pbVar6 + (ulong)(uVar8 - 1) + 3;
              }
            }
            pbVar7 = b + uVar4;
            if (pbVar10 < pbVar7) {
              return 0;
            }
            iVar1 = mp_read_unsigned_bin(keyP,b,(int)uVar4);
            if (iVar1 != 0) {
              return 0;
            }
            bVar2 = *pbVar7;
          }
          if ((bVar2 & 0x3f) == 2) {
            bVar2 = pbVar7[1];
            pbVar6 = pbVar7 + 2;
            uVar8 = bVar2 & 0x7f;
            uVar4 = (ulong)uVar8;
            if ((char)bVar2 < '\0') {
              if ((char)uVar8 == '\0') {
                uVar4 = 0;
              }
              else {
                lVar9 = 0;
                uVar4 = 0;
                do {
                  uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
                  lVar9 = lVar9 + 1;
                } while ((bVar2 & 0x7f) != (uint)lVar9);
                pbVar6 = pbVar7 + (ulong)(uVar8 - 1) + 3;
              }
            }
            pbVar7 = pbVar6 + uVar4;
            if (pbVar10 < pbVar7) {
              return 0;
            }
            iVar1 = mp_read_unsigned_bin(keyQ,pbVar6,(int)uVar4);
            if (iVar1 != 0) {
              return 0;
            }
            bVar2 = *pbVar7;
          }
          if ((bVar2 & 0x3f) == 2) {
            bVar2 = pbVar7[1];
            pbVar6 = pbVar7 + 2;
            uVar8 = bVar2 & 0x7f;
            uVar4 = (ulong)uVar8;
            if ((char)bVar2 < '\0') {
              if ((char)uVar8 == '\0') {
                uVar4 = 0;
              }
              else {
                lVar9 = 0;
                uVar4 = 0;
                do {
                  uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
                  lVar9 = lVar9 + 1;
                } while ((bVar2 & 0x7f) != (uint)lVar9);
                pbVar6 = pbVar7 + (ulong)(uVar8 - 1) + 3;
              }
            }
            pbVar7 = pbVar6 + uVar4;
            if (pbVar10 < pbVar7) {
              return 0;
            }
            iVar1 = mp_read_unsigned_bin(keyG,pbVar6,(int)uVar4);
            if (iVar1 != 0) {
              return 0;
            }
            bVar2 = *pbVar7;
          }
        }
      }
      uVar8 = uVar5;
      if ((bVar2 & 0x3f) == 3) {
        bVar2 = pbVar7[1];
        pbVar6 = pbVar7 + 2;
        uVar5 = bVar2 & 0x7f;
        uVar4 = (ulong)uVar5;
        if ((char)bVar2 < '\0') {
          if ((char)uVar5 == '\0') {
            uVar4 = 0;
          }
          else {
            lVar9 = 0;
            uVar4 = 0;
            do {
              uVar4 = (ulong)pbVar6[lVar9] | uVar4 << 8;
              lVar9 = lVar9 + 1;
            } while ((bVar2 & 0x7f) != (uint)lVar9);
            pbVar6 = pbVar7 + (ulong)(uVar5 - 1) + 3;
          }
        }
        if (((pbVar7 + uVar4 + 1 <= pbVar10) && (*pbVar6 == 0)) && ((pbVar6[1] & 0x3f) == 2)) {
          bVar2 = pbVar6[2];
          pbVar7 = pbVar6 + 3;
          uVar5 = bVar2 & 0x7f;
          uVar4 = (ulong)uVar5;
          if ((char)bVar2 < '\0') {
            if ((char)uVar5 == '\0') {
              uVar4 = 0;
            }
            else {
              lVar9 = 0;
              uVar4 = 0;
              do {
                uVar4 = (ulong)pbVar7[lVar9] | uVar4 << 8;
                lVar9 = lVar9 + 1;
              } while ((bVar2 & 0x7f) != (uint)lVar9);
              pbVar7 = pbVar6 + (ulong)(uVar5 - 1) + 4;
            }
          }
          if (pbVar7 + uVar4 <= pbVar10) {
            iVar1 = mp_read_unsigned_bin(keyY,pbVar7,(int)uVar4);
            uVar8 = (uint)(iVar1 == 0);
          }
        }
      }
    }
  }
  return uVar8;
}

Assistant:

int parse_der_pubkey(const unsigned char* der, size_t len, mp_int* keyP, mp_int* keyQ, mp_int* keyG, mp_int* keyY)
{
	static unsigned char ansi_x9_57[] = { 0x2A, 0x86, 0x48, 0xCE, 0x38, 0x04, 0x01 };
	const unsigned char* end = der + len;

	SEQUENCE
	{
		if ((++der + _parse_length(&der)) > end)
			return 0;

		SEQUENCE
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			OBJECT_IDENTIFIER
			{
				der++;
				size_t length = _parse_length(&der);

				if (length != sizeof(ansi_x9_57) || (length == sizeof(ansi_x9_57) && memcmp(der, ansi_x9_57, length) != 0))
					return 0;

				der += length;
			}

			SEQUENCE
			{
				if ((++der + _parse_length(&der)) > end)
					return 0;

				INTEGER
				{
					// p
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyP, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// q
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyQ, der, length) != MP_OKAY)
						return 0;

					der += length;
				}

				INTEGER
				{
					// g
					der++;
					size_t length = _parse_length(&der);

					if ((der + length) > end)
						return 0;

					if (mp_read_unsigned_bin(keyG, der, length) != MP_OKAY)
						return 0;

					der += length;
				}
			}
		}

		BIT_STRING
		{
			if ((++der + _parse_length(&der)) > end)
				return 0;

			if (*der++ != 0)
				return 0;

			INTEGER
			{
				// y
				der++;
				size_t length = _parse_length(&der);

				if ((der + length) > end)
					return 0;

				return (mp_read_unsigned_bin(keyY, der, length) == MP_OKAY);
			}
		}
	}

	return 0;
}